

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buckets.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::
node_constructor<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
::construct(node_constructor<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
            *this)

{
  pointer ppVar1;
  type local_28;
  undefined8 uStack_20;
  
  if (this->node_ == (node_pointer)0x0) {
    this->node_constructed_ = false;
    this->value_constructed_ = false;
    ppVar1 = allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_unsigned_int,_double>_>_>_>
             ::allocate(this->alloc_,1);
    this->node_ = ppVar1;
    (ppVar1->super_value_base<std::pair<const_unsigned_int,_double>_>).data_.data_.align_ = local_28
    ;
    *(undefined8 *)
     ((long)&(ppVar1->super_value_base<std::pair<const_unsigned_int,_double>_>).data_.data_ + 8) =
         uStack_20;
    (ppVar1->super_ptr_bucket).next_ = (link_pointer)0x0;
    ppVar1->hash_ = 0;
    this->node_constructed_ = true;
  }
  else if (this->value_constructed_ == true) {
    this->value_constructed_ = false;
  }
  return;
}

Assistant:

void node_constructor<Alloc>::construct()
    {
        if(!node_) {
            node_constructed_ = false;
            value_constructed_ = false;

            node_ = node_allocator_traits::allocate(alloc_, 1);

            node_allocator_traits::construct(alloc_,
                boost::addressof(*node_), node());
            node_->init(node_);
            node_constructed_ = true;
        }
        else {
            BOOST_ASSERT(node_constructed_);

            if (value_constructed_)
            {
                boost::unordered::detail::func::destroy_value_impl(alloc_,
                    node_->value_ptr());
                value_constructed_ = false;
            }
        }
    }